

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord3f *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_2c [8];
  float3 v;
  texcoord3f *value_local;
  AsciiParser *this_local;
  
  v._M_elems._4_8_ = value;
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_2c);
  if (bVar1) {
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,0);
    *(value_type_conflict6 *)v._M_elems._4_8_ = *pvVar2;
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,1);
    *(value_type_conflict6 *)(v._M_elems._4_8_ + 4) = *pvVar2;
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,2);
    *(value_type_conflict6 *)(v._M_elems._4_8_ + 8) = *pvVar2;
  }
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord3f *value) {

  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    value->r = v[2];
    return true;
  }

  return true;
}